

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lm_trie_quant.c
# Opt level: O0

void lm_trie_quant_mwrite
               (lm_trie_quant_t *quant,bitarr_address_t address,int order_minus_2,float32 prob,
               float32 backoff)

{
  uint8 uVar1;
  uint8 uVar2;
  byte bVar3;
  uint64 uVar4;
  uint64 uVar5;
  bitarr_address_t address_00;
  float32 backoff_local;
  float32 prob_local;
  int order_minus_2_local;
  lm_trie_quant_t *quant_local;
  bitarr_address_t address_local;
  
  uVar1 = quant->prob_bits;
  uVar2 = quant->bo_bits;
  uVar4 = bins_encode(quant->tables[order_minus_2],prob);
  bVar3 = quant->bo_bits;
  uVar5 = bins_encode(quant->tables[order_minus_2] + 1,backoff);
  address_00._12_4_ = 0;
  address_00.base = (void *)SUB128(address._0_12_,0);
  address_00.offset = SUB124(address._0_12_,8);
  bitarr_write_int57(address_00,uVar1 + uVar2,uVar4 << (bVar3 & 0x3f) | uVar5);
  return;
}

Assistant:

void
lm_trie_quant_mwrite(lm_trie_quant_t * quant, bitarr_address_t address,
                     int order_minus_2, float32 prob, float32 backoff)
{
    bitarr_write_int57(address, quant->prob_bits + quant->bo_bits,
                       (uint64) ((bins_encode
                                  (&quant->tables[order_minus_2][0],
                                   prob) << quant->
                                  bo_bits) | bins_encode(&quant->
                                                         tables
                                                         [order_minus_2]
                                                         [1],
                                                         backoff)));
}